

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O1

path * boost::filesystem::detail::weakly_canonical
                 (path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  path *ppVar9;
  _Alloc_hider _Var10;
  int iVar11;
  path head;
  file_status head_status;
  path tail;
  error_code tmp_ec;
  iterator itr;
  path local_108;
  path local_e8;
  path *local_c8;
  size_type local_c0;
  error_code *local_b8;
  path local_b0;
  path local_90;
  error_code local_70;
  iterator local_60;
  
  local_108.m_pathname._M_dataplus._M_p = (pointer)&local_108.m_pathname.field_2;
  pcVar4 = (p->m_pathname)._M_dataplus._M_p;
  local_b8 = ec;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar4,pcVar4 + (p->m_pathname)._M_string_length);
  local_b0.m_pathname._M_dataplus._M_p = (pointer)&local_b0.m_pathname.field_2;
  local_b0.m_pathname._M_string_length = 0;
  local_b0.m_pathname.field_2._M_local_buf[0] = '\0';
  local_70.m_val = 0;
  local_70.m_cat = system::system_category();
  path::end(p);
  paVar1 = &(__return_storage_ptr__->m_pathname).field_2;
  while (local_108.m_pathname._M_string_length != 0) {
    status((detail *)&local_e8,&local_108,&local_70);
    iVar6 = (int)local_e8.m_pathname._M_dataplus._M_p;
    bVar7 = anon_unknown.dwarf_59c2::error
                      ((uint)((int)local_e8.m_pathname._M_dataplus._M_p == 0),&local_108,local_b8,
                       "boost::filesystem::weakly_canonical");
    if (bVar7) {
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar1;
      (__return_storage_ptr__->m_pathname)._M_string_length = 0;
      (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
      iVar11 = 1;
    }
    else {
      iVar11 = 2;
      if (iVar6 == 1) {
        iVar11 = 0;
        path::remove_filename(&local_108);
      }
    }
    if (iVar11 != 0) {
      if (iVar11 != 2) goto LAB_0010d129;
      break;
    }
    path::m_path_iterator_decrement(&local_60);
  }
  paVar2 = &local_e8.m_pathname.field_2;
  bVar7 = false;
  while( true ) {
    path::end(p);
    bVar8 = local_c0 == local_60.m_pos;
    bVar5 = local_60.m_path_ptr == local_c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8.m_pathname._M_dataplus._M_p,
                      local_e8.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if (bVar8 && bVar5) break;
    path::operator/=(&local_b0,&local_60.m_element);
    if (((local_60.m_element.m_pathname._M_string_length < 3) &&
        (*local_60.m_element.m_pathname._M_dataplus._M_p == '.')) &&
       ((local_60.m_element.m_pathname._M_string_length == 1 ||
        (local_60.m_element.m_pathname._M_dataplus._M_p[1] == '.')))) {
      bVar7 = true;
    }
    path::m_path_iterator_increment(&local_60);
  }
  if (local_108.m_pathname._M_string_length == 0) {
    path::lexically_normal(__return_storage_ptr__,p);
  }
  else {
    current_path(&local_e8,(error_code *)0x0);
    canonical(&local_90,&local_108,&local_e8,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.m_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8.m_pathname._M_dataplus._M_p,
                      local_e8.m_pathname.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::operator=((string *)&local_108,(string *)&local_90);
    paVar3 = &local_90.m_pathname.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.m_pathname._M_dataplus._M_p != paVar3) {
      operator_delete(local_90.m_pathname._M_dataplus._M_p,
                      local_90.m_pathname.field_2._M_allocated_capacity + 1);
    }
    bVar8 = anon_unknown.dwarf_59c2::error
                      (local_70.m_val,&local_108,local_b8,"boost::filesystem::weakly_canonical");
    if (bVar8) {
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar1;
      (__return_storage_ptr__->m_pathname)._M_string_length = 0;
      (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
    }
    else if (local_b0.m_pathname._M_string_length == 0) {
      (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_108.m_pathname._M_dataplus._M_p,
                 local_108.m_pathname._M_dataplus._M_p + local_108.m_pathname._M_string_length);
    }
    else {
      local_e8.m_pathname._M_dataplus._M_p = (pointer)paVar2;
      if (bVar7) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,local_108.m_pathname._M_dataplus._M_p,
                   local_108.m_pathname._M_dataplus._M_p + local_108.m_pathname._M_string_length);
        ppVar9 = path::operator/=(&local_e8,&local_b0);
        pcVar4 = (ppVar9->m_pathname)._M_dataplus._M_p;
        local_90.m_pathname._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar4,pcVar4 + (ppVar9->m_pathname)._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.m_pathname._M_dataplus._M_p != paVar2) {
          operator_delete(local_e8.m_pathname._M_dataplus._M_p,
                          local_e8.m_pathname.field_2._M_allocated_capacity + 1);
        }
        path::lexically_normal(__return_storage_ptr__,&local_90);
        local_e8.m_pathname.field_2._M_allocated_capacity =
             local_90.m_pathname.field_2._M_allocated_capacity;
        _Var10._M_p = local_90.m_pathname._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90.m_pathname._M_dataplus._M_p == paVar3) goto LAB_0010d129;
      }
      else {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,local_108.m_pathname._M_dataplus._M_p,
                   local_108.m_pathname._M_dataplus._M_p + local_108.m_pathname._M_string_length);
        ppVar9 = path::operator/=(&local_e8,&local_b0);
        (__return_storage_ptr__->m_pathname)._M_dataplus._M_p = (pointer)paVar1;
        pcVar4 = (ppVar9->m_pathname)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar4,
                   pcVar4 + (ppVar9->m_pathname)._M_string_length);
        _Var10._M_p = local_e8.m_pathname._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8.m_pathname._M_dataplus._M_p == paVar2) goto LAB_0010d129;
      }
      operator_delete(_Var10._M_p,local_e8.m_pathname.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0010d129:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.m_element.m_pathname._M_dataplus._M_p != &local_60.m_element.m_pathname.field_2) {
    operator_delete(local_60.m_element.m_pathname._M_dataplus._M_p,
                    local_60.m_element.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_pathname._M_dataplus._M_p != &local_b0.m_pathname.field_2) {
    operator_delete(local_b0.m_pathname._M_dataplus._M_p,
                    CONCAT71(local_b0.m_pathname.field_2._M_allocated_capacity._1_7_,
                             local_b0.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.m_pathname._M_dataplus._M_p != &local_108.m_pathname.field_2) {
    operator_delete(local_108.m_pathname._M_dataplus._M_p,
                    local_108.m_pathname.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path weakly_canonical(const path& p, system::error_code* ec)
  {
    path head(p);
    path tail;
    system::error_code tmp_ec;
    path::iterator itr = p.end();

    for (; !head.empty(); --itr)
    {
      file_status head_status = status(head, tmp_ec);
      if (error(head_status.type() == fs::status_error,
        head, ec, "boost::filesystem::weakly_canonical"))
        return path();
      if (head_status.type() != fs::file_not_found)
        break;
      head.remove_filename();
    }

    bool tail_has_dots = false;
    for (; itr != p.end(); ++itr)
    { 
      tail /= *itr;
      // for a later optimization, track if any dot or dot-dot elements are present
      if (itr->native().size() <= 2
        && itr->native()[0] == dot
        && (itr->native().size() == 1 || itr->native()[1] == dot))
        tail_has_dots = true;
    }
    
    if (head.empty())
      return p.lexically_normal();
    head = canonical(head, tmp_ec);
    if (error(tmp_ec.value(), head, ec, "boost::filesystem::weakly_canonical"))
      return path();
    return tail.empty()
      ? head
      : (tail_has_dots  // optimization: only normalize if tail had dot or dot-dot element
          ? (head/tail).lexically_normal()  
          : head/tail);
  }